

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

Vec_Int_t * Gia_ManGetTestPatterns(char *pFileName)

{
  uint uVar1;
  uint uVar2;
  FILE *__stream;
  Vec_Int_t *p;
  int *piVar3;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open input file \"%s\".\n",pFileName);
    return (Vec_Int_t *)0x0;
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 10000;
  p->nSize = 0;
  piVar3 = (int *)malloc(40000);
  p->pArray = piVar3;
LAB_00535b24:
  uVar2 = fgetc(__stream);
  uVar1 = uVar2 + 1;
  if (uVar1 < 0x22) goto code_r0x00535b34;
  goto LAB_00535b3f;
code_r0x00535b34:
  if ((0x200004c00U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
    if ((ulong)uVar1 == 0) goto LAB_00535b9b;
LAB_00535b3f:
    if (uVar2 - 0x32 < 0xfffffffe) {
      printf("Wring symbol (%c) in the input file.\n",(ulong)uVar2);
      if (p->pArray != (int *)0x0) {
        free(p->pArray);
        p->pArray = (int *)0x0;
      }
      free(p);
      p = (Vec_Int_t *)0x0;
LAB_00535b9b:
      fclose(__stream);
      return p;
    }
    Vec_IntPush(p,uVar2 - 0x30);
  }
  goto LAB_00535b24;
}

Assistant:

Vec_Int_t * Gia_ManGetTestPatterns( char * pFileName )
{
    FILE * pFile = fopen( pFileName, "rb" );
    Vec_Int_t * vTests; int c;
    if ( pFile == NULL )
    {
        printf( "Cannot open input file \"%s\".\n", pFileName );
        return NULL;
    }
    vTests = Vec_IntAlloc( 10000 );
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == ' ' || c == '\t' || c == '\r' || c == '\n' )
            continue;
        if ( c != '0' && c != '1' )
        {
            printf( "Wring symbol (%c) in the input file.\n", c );
            Vec_IntFreeP( &vTests );
            break;
        }
        Vec_IntPush( vTests, c - '0' );
    }
    fclose( pFile );
    return vTests;
}